

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsonArray.cpp
# Opt level: O0

json_array_element_t * __thiscall Json::JsonArray::get(JsonArray *this,int index)

{
  int iVar1;
  JsonException *this_00;
  reference pvVar2;
  allocator<char> local_39;
  string local_38;
  int local_14;
  JsonArray *pJStack_10;
  int index_local;
  JsonArray *this_local;
  
  local_14 = index;
  pJStack_10 = this;
  if (-1 < index) {
    iVar1 = size(this);
    if (index < iVar1) {
      pvVar2 = std::
               vector<std::shared_ptr<Json::JsonValue>,_std::allocator<std::shared_ptr<Json::JsonValue>_>_>
               ::at(&this->__lstJsonArray,(long)local_14);
      return pvVar2;
    }
  }
  this_00 = (JsonException *)__cxa_allocate_exception(0x50);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,"Error: Invalid Index",&local_39);
  JsonException::JsonException(this_00,&local_38);
  __cxa_throw(this_00,&JsonException::typeinfo,JsonException::~JsonException);
}

Assistant:

const Json::JsonArray::json_array_element_t &Json::JsonArray::get(int index) {
    if (index < 0 || index >= size())throw JsonException("Error: Invalid Index");
    return __lstJsonArray.at(index);
}